

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptWeakMap.cpp
# Opt level: O0

void __thiscall Js::JavascriptWeakMap::Clear(JavascriptWeakMap *this)

{
  JavascriptWeakMap *this_local;
  
  JsUtil::
  WeakReferenceRegionKeyDictionary<Js::RecyclableObject*,bool,RecyclerPointerComparer,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,JsUtil::NoResizeLock>
  ::Map<Js::JavascriptWeakMap::Clear()::__0>
            ((WeakReferenceRegionKeyDictionary<Js::RecyclableObject*,bool,RecyclerPointerComparer,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,JsUtil::NoResizeLock>
              *)&this->keySet,(anon_class_8_1_8991fb9c_for_fn)this);
  JsUtil::
  SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
  ::Clear(&(this->keySet).
           super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
         );
  return;
}

Assistant:

void JavascriptWeakMap::Clear()
    {
        keySet.Map([&](RecyclableObject* key, bool value, WeakType weakRef) {
            WeakMapKeyMap* keyMap = GetWeakMapKeyMapFromKey(key);

            // It may be the case that a CEO has been reset and the keyMap is now null.
            // Just ignore it in this case, the keyMap has already been collected.
            if (keyMap != nullptr)
            {
                // It may also be the case that a CEO has been reset and then added to a separate WeakMap,
                // creating a new WeakMapKeyMap on the CEO.  In this case GetWeakMapId() may not be in the
                // keyMap, so don't assert successful removal here.
                keyMap->Remove(GetWeakMapId());
            }
        });
        keySet.Clear();
    }